

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# point.cc
# Opt level: O0

unique_ptr<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>_> __thiscall
lf::geometry::Point::SubGeometry(Point *this,dim_t codim,dim_t i)

{
  runtime_error *this_00;
  int in_ECX;
  undefined4 in_register_00000034;
  string local_230;
  allocator<char> local_209;
  string local_208;
  allocator<char> local_1e1;
  string local_1e0;
  stringstream local_1b0 [8];
  stringstream ss;
  ostream local_1a0 [376];
  Matrix<double,__1,_1,_0,__1,_1> local_28;
  dim_t i_local;
  dim_t codim_local;
  Point *this_local;
  
  _i_local = CONCAT44(in_register_00000034,codim);
  local_28.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows._4_4_ = i
  ;
  this_local = this;
  if ((i == 0) && (in_ECX == 0)) {
    std::make_unique<lf::geometry::Point,Eigen::Matrix<double,_1,1,0,_1,1>const&>(&local_28);
    std::unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>>::
    unique_ptr<lf::geometry::Point,std::default_delete<lf::geometry::Point>,void>
              ((unique_ptr<lf::geometry::Geometry,std::default_delete<lf::geometry::Geometry>> *)
               this,(unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
                    &local_28);
    std::unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_>::~unique_ptr
              ((unique_ptr<lf::geometry::Point,_std::default_delete<lf::geometry::Point>_> *)
               &local_28);
    return (__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
            )(__uniq_ptr_data<lf::geometry::Geometry,_std::default_delete<lf::geometry::Geometry>,_true,_true>
              )this;
  }
  std::__cxx11::stringstream::stringstream(local_1b0);
  std::operator<<(local_1a0,"codim or i out of bounds.");
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,"false",&local_1e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_208,
             "/workspace/llm4binary/github/license_c_cmakelists/craffael[P]lehrfempp/lib/lf/geometry/point.cc"
             ,&local_209);
  std::__cxx11::stringstream::str();
  lf::base::AssertionFailed(&local_1e0,&local_208,0x1b,&local_230);
  std::__cxx11::string::~string((string *)&local_230);
  std::__cxx11::string::~string((string *)&local_208);
  std::allocator<char>::~allocator(&local_209);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"this code should not be reached");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::unique_ptr<Geometry> Point::SubGeometry(dim_t codim, dim_t i) const {
  if (codim == 0 && i == 0) {
    return std::make_unique<Point>(coord_);
  }
  LF_VERIFY_MSG(false, "codim or i out of bounds.");
}